

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_ELSI.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  byte bVar2;
  time_t tVar3;
  ostream *poVar4;
  undefined8 uVar5;
  GMAA_MAA_ELSI *this;
  type pJVar6;
  undefined8 in_RSI;
  undefined4 in_EDI;
  bool bVar7;
  double dVar8;
  double dVar9;
  E *e;
  char s [10];
  E *e_1;
  stringstream ss_1;
  OptimalValueDatabase db;
  clock_t utime_Qcomp;
  clock_t time_Qcomp;
  clock_t utime_maa;
  clock_t time_maa;
  clock_t utime;
  clock_t ticks;
  string bgFilename;
  double V;
  PlanningUnitMADPDiscreteParameters params;
  clock_t ticks_after;
  clock_t ticks_Qcomp;
  clock_t ticks_before;
  tms ts_after;
  tms ts_Qcomp;
  tms ts_before;
  stringstream ss;
  ofstream of;
  string timingsFilename;
  string filename;
  FactoredQFunctionStateJAOHInterface *q;
  GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *gmaa;
  bool optimalSolutionMethod;
  FactoredDecPOMDPDiscreteInterface *decpomdp;
  Timing Time;
  int restarts;
  int k;
  int horizon;
  Qheur_t Qheur;
  bool errorOccurred;
  Arguments args;
  string *in_stack_fffffffffffff128;
  ostream *in_stack_fffffffffffff130;
  char *in_stack_fffffffffffff150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff158;
  allocator<char> *in_stack_fffffffffffff160;
  ostream *in_stack_fffffffffffff168;
  Arguments *in_stack_fffffffffffff170;
  allocator<char> local_c41;
  string local_c40 [32];
  shared_ptr<JointPolicyDiscretePure> local_c20 [16];
  string local_c10 [38];
  char local_bea [18];
  string local_bd8 [32];
  string local_bb8 [32];
  stringstream local_b98 [16];
  ostream local_b88 [376];
  string local_a10 [32];
  OptimalValueDatabase local_9f0 [128];
  long local_970;
  long local_968;
  long local_960;
  long local_958;
  long local_950;
  long local_948;
  shared_ptr<JointPolicyDiscretePure> local_940 [23];
  allocator<char> local_929;
  string local_928 [39];
  allocator<char> local_901;
  string local_900 [39];
  allocator<char> local_8d9;
  string local_8d8 [39];
  allocator<char> local_8b1;
  string local_8b0 [39];
  allocator<char> local_889;
  string local_888 [32];
  string local_868 [39];
  allocator<char> local_841;
  string local_840 [32];
  double local_820;
  PlanningUnitMADPDiscreteParameters local_811 [9];
  clock_t local_808;
  clock_t local_800;
  clock_t local_7f8;
  tms local_7f0;
  tms local_7d0;
  tms local_7b0;
  string local_790 [32];
  string local_770 [36];
  uint local_74c;
  string local_748 [32];
  string local_728 [39];
  allocator<char> local_701;
  MultiAgentDecisionProcessInterface local_700 [32];
  string local_6e0 [32];
  stringstream local_6c0 [16];
  ostream local_6b0 [376];
  long local_538 [64];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [32];
  FactoredQFunctionStateJAOHInterface *local_2e8;
  PlanningUnitDecPOMDPDiscrete *local_2e0;
  byte local_2d1;
  FactoredDecPOMDPDiscreteInterface *local_2d0;
  allocator<char> local_2c1;
  string local_2c0 [32];
  Timing local_2a0 [56];
  int local_268;
  int local_264;
  int local_260;
  Qheur_t local_25c;
  byte local_255;
  Arguments local_248;
  undefined8 local_10;
  undefined4 local_8;
  uint local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffff170);
  argp_parse(ArgumentHandlers::theArgpStruc,local_8,local_10,0,0,&local_248);
  local_255 = 0;
  local_25c = local_248.qheur;
  local_260 = local_248.horizon;
  local_264 = local_248.k;
  local_268 = local_248.nrRestarts;
  Timing::Timing(local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Start((string *)local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  local_2d0 = (FactoredDecPOMDPDiscreteInterface *)
              ArgumentUtils::GetFactoredDecPOMDPDiscreteInterfaceFromArgs(&local_248);
  lVar1 = *(long *)(*(long *)local_2d0 + -0xf8);
  (**(code **)(*(long *)(local_2d0 + lVar1) + 0x210))
            (local_2d0 + lVar1,local_248.sparse != 0,lVar1,local_248.sparse != 0);
  local_2d1 = 0;
  if ((local_248.gmaa == MAAstar) || (local_248.gmaa == MAAstarClassic)) {
    local_2d1 = 1;
  }
  local_2e0 = (PlanningUnitDecPOMDPDiscrete *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  std::allocator<char>::~allocator(&local_331);
  std::ofstream::ofstream(local_538);
  if (local_248.dryrun == 0) {
    std::__cxx11::stringstream::stringstream(local_6c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160
              );
    directories::MADPGetResultsFilename
              (local_6e0,local_700,(Arguments *)(local_2d0 + *(long *)(*(long *)local_2d0 + -0x40)))
    ;
    poVar4 = std::operator<<(local_6b0,local_6e0);
    poVar4 = std::operator<<(poVar4,"_");
    qheur::SoftPrint_abi_cxx11_((Qheur_t)local_728);
    poVar4 = std::operator<<(poVar4,local_728);
    poVar4 = std::operator<<(poVar4,"_h");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_260);
    poVar4 = std::operator<<(poVar4,"_restarts");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_268);
    poVar4 = std::operator<<(poVar4,"_k");
    std::ostream::operator<<(poVar4,local_264);
    std::__cxx11::string::~string(local_728);
    std::__cxx11::string::~string(local_6e0);
    std::__cxx11::string::~string((string *)local_700);
    std::allocator<char>::~allocator(&local_701);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_308,local_748);
    std::__cxx11::string::~string(local_748);
    uVar5 = std::__cxx11::string::c_str();
    std::ofstream::open(local_538,uVar5,0x10);
    bVar2 = std::ios::operator!((ios *)((long)local_538 + *(long *)(local_538[0] + -0x18)));
    bVar7 = (bVar2 & 1) != 0;
    if (bVar7) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"GMAA: could not open ");
      poVar4 = std::operator<<(poVar4,local_308);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
    }
    else {
      std::operator+(in_stack_fffffffffffff158,in_stack_fffffffffffff150);
      std::__cxx11::string::operator=(local_330,local_770);
      std::__cxx11::string::~string(local_770);
      poVar4 = std::operator<<((ostream *)&std::cout,"Computing ");
      std::__cxx11::stringstream::str();
      poVar4 = std::operator<<(poVar4,local_790);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_790);
    }
    local_74c = (uint)bVar7;
    std::__cxx11::stringstream::~stringstream(local_6c0);
    if (local_74c != 0) goto LAB_0010804d;
  }
  local_7f8 = times(&local_7b0);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_811);
  if (3 < local_260) {
    PlanningUnitMADPDiscreteParameters::SetComputeJointBeliefs(local_811,false);
    PlanningUnitMADPDiscreteParameters::SetComputeJointActionObservationHistories(local_811,false);
  }
  if (local_248.sparse == 0) {
    PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_811,false);
  }
  else {
    PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_811,true);
  }
  local_820 = -1.79769313486232e+308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Start((string *)local_2a0);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator(&local_841);
  this = (GMAA_MAA_ELSI *)operator_new(0x448);
  GMAA_MAA_ELSI::GMAA_MAA_ELSI(this,(long)local_260,local_2d0,local_811);
  local_2e0 = (PlanningUnitDecPOMDPDiscrete *)this;
  if (local_248.dryrun == 0) {
    if (local_248.saveTimings != 0) {
      GeneralizedMAAStarPlanner::SetIntermediateTimingFilename((string *)(this + 0x340));
    }
    if (local_248.saveAllBGs != 0) {
      std::operator+(in_stack_fffffffffffff158,in_stack_fffffffffffff150);
      GeneralizedMAAStarPlanner::SetSaveAllBGs
                ((GeneralizedMAAStarPlanner *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
      std::__cxx11::string::~string(local_868);
    }
  }
  if (local_248.verbose != 0) {
    GeneralizedMAAStarPlanner::SetVerbose((int)local_2e0 + 0x340);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Stop((string *)local_2a0);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  poVar4 = std::operator<<((ostream *)&std::cout,"GMAA Planner initialized");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_2e8 = getQheuristic((GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *)
                            in_stack_fffffffffffff170,
                            (Qheur_t)((ulong)in_stack_fffffffffffff168 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Start((string *)local_2a0);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  (**(code **)(*(long *)(local_2e8 + *(long *)(*(long *)local_2e8 + -0x60)) + 0x10))
            (local_2e8 + *(long *)(*(long *)local_2e8 + -0x60));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Stop((string *)local_2a0);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  local_800 = times(&local_7d0);
  poVar4 = std::operator<<((ostream *)&std::cout,"Q heuristic computed");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete::SetFactoredQHeuristic
            ((GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *)local_2e0,local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Start((string *)local_2a0);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator(&local_901);
  (**(code **)(*(long *)local_2e0 + 0x18))();
  local_820 = (double)(**(code **)(*(long *)local_2e0 + 0x98))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Stop((string *)local_2a0);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator(&local_929);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nvalue=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_820);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (-1 < local_248.verbose) {
    GeneralizedMAAStarPlanner::GetJointPolicyDiscretePure();
    pJVar6 = boost::shared_ptr<JointPolicyDiscretePure>::operator->(local_940);
    (**(code **)(*(long *)pJVar6 + 0x38))();
    boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<JointPolicyDiscretePure> *)0x10730f);
  }
  local_808 = times(&local_7f0);
  local_948 = local_808 - local_7f8;
  local_950 = local_7f0.tms_utime - local_7b0.tms_utime;
  local_958 = local_808 - local_800;
  local_960 = local_7f0.tms_utime - local_7d0.tms_utime;
  local_968 = local_800 - local_7f8;
  local_970 = local_7d0.tms_utime - local_7b0.tms_utime;
  OptimalValueDatabase::OptimalValueDatabase(local_9f0,local_2e0);
  poVar4 = std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: entry \'");
  OptimalValueDatabase::GetEntryName_abi_cxx11_();
  poVar4 = std::operator<<(poVar4,local_a10);
  poVar4 = std::operator<<(poVar4,"\'");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a10);
  if ((local_2d1 & 1) == 0) {
    bVar2 = OptimalValueDatabase::IsInDatabase();
    if ((bVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: Optimal value unknown.")
      ;
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      if ((local_248.testMode & 1U) != 0) {
        local_255 = 1;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: Computed value is ");
      dVar8 = local_820;
      dVar9 = (double)OptimalValueDatabase::GetOptimalValue();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8 / dVar9);
      poVar4 = std::operator<<(poVar4," of optimal (value ");
      dVar8 = (double)OptimalValueDatabase::GetOptimalValue();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      dVar8 = local_820;
      dVar9 = (double)OptimalValueDatabase::GetOptimalValue();
      if (dVar9 < dVar8) {
        local_255 = 1;
      }
    }
  }
  else {
    bVar2 = OptimalValueDatabase::IsInDatabase();
    if ((bVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: Optimal value unknown.")
      ;
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      if ((local_248.testMode & 1U) == 0) {
        OptimalValueDatabase::SetOptimalValue(local_820);
      }
      else {
        local_255 = 1;
      }
    }
    else {
      bVar2 = OptimalValueDatabase::IsOptimal(local_820);
      if ((bVar2 & 1) == 0) {
        std::__cxx11::stringstream::stringstream(local_b98);
        poVar4 = std::operator<<(local_b88,"OptimalValueDatabase: GMAA error, computed value ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_820);
        poVar4 = std::operator<<(poVar4," does not match");
        poVar4 = std::operator<<(poVar4," previously computed optimal value ");
        dVar8 = (double)OptimalValueDatabase::GetOptimalValue();
        std::ostream::operator<<(poVar4,dVar8);
        std::__cxx11::stringstream::str();
        poVar4 = std::operator<<((ostream *)local_538,local_bb8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_bb8);
        std::__cxx11::stringstream::str();
        poVar4 = std::operator<<((ostream *)&std::cout,local_bd8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_bd8);
        local_255 = 1;
        std::__cxx11::stringstream::~stringstream(local_b98);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "OptimalValueDatabase: Computed value matches with OptimalValueDatabase"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  if (local_248.dryrun == 0) {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_260);
    std::operator<<(poVar4,"\t");
    sprintf(local_bea,"%.6f",local_820);
    poVar4 = std::operator<<((ostream *)local_538,local_bea);
    std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_948);
    std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_950);
    std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_958);
    std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_960);
    std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_968);
    std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_970);
    std::operator<<(poVar4,"\t");
    in_stack_fffffffffffff170 =
         (Arguments *)
         GeneralizedMAAStarPlanner::GetNrEvaluatedJPolBGs
                   ((GeneralizedMAAStarPlanner *)(local_2e0 + 0x340));
    in_stack_fffffffffffff168 =
         (ostream *)
         std::ostream::operator<<((ostream *)local_538,(ulonglong)in_stack_fffffffffffff170);
    std::operator<<(in_stack_fffffffffffff168,"\t");
    in_stack_fffffffffffff160 =
         (allocator<char> *)
         GeneralizedMAAStarPlanner::GetMaxJPolPoolSize
                   ((GeneralizedMAAStarPlanner *)(local_2e0 + 0x340));
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)local_538,(ulonglong)in_stack_fffffffffffff160);
    std::operator<<(poVar4,"\t");
    GeneralizedMAAStarPlanner::GetJointPolicyDiscretePure();
    pJVar6 = boost::shared_ptr<JointPolicyDiscretePure>::operator->(local_c20);
    (**(code **)(*(long *)pJVar6 + 0xa8))(local_c10);
    poVar4 = std::operator<<((ostream *)local_538,local_c10);
    std::operator<<(poVar4,"\t");
    std::__cxx11::string::~string(local_c10);
    boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<JointPolicyDiscretePure> *)0x107e4d);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_538,local_264);
    std::operator<<(poVar4,"\n");
    std::ostream::flush();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff170,(char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  Timing::Stop((string *)local_2a0);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator(&local_c41);
  if (-1 < local_248.verbose) {
    in_stack_fffffffffffff130 =
         (ostream *)
         std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(in_stack_fffffffffffff130,"Timing summary");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Timing::PrintSummary();
    TimedAlgorithm::PrintTimersSummary();
  }
  if ((local_248.saveTimings != 0) && (local_248.dryrun == 0)) {
    TimedAlgorithm::SaveTimers((string *)(local_2e0 + 0x340));
  }
  OptimalValueDatabase::~OptimalValueDatabase((OptimalValueDatabase *)in_stack_fffffffffffff130);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_811);
  local_74c = 0;
LAB_0010804d:
  std::ofstream::~ofstream(local_538);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_308);
  Timing::~Timing(local_2a0);
  if (local_74c == 0) {
    local_4 = (uint)(local_255 & 1);
    local_74c = 1;
  }
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x108170);
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    bool errorOccurred=false;

    Qheur_t Qheur=args.qheur;
    int horizon=args.horizon;
    int k=args.k;
    int restarts=args.nrRestarts;
   
    try {

    Timing Time;    
    Time.Start("Overall");

    srand(time(0));

    FactoredDecPOMDPDiscreteInterface* decpomdp = 
        GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
    decpomdp->CacheFlatModels(args.sparse);
    
//    we have no sparse trans., observ. models for FactoredDecPOMDPDiscrete
//    (they are specified by a 2DNB which should be sparse enough)
//     if(args.sparse) 
//         decpomdp->SetSparse(true);

     bool optimalSolutionMethod=false;
     if(args.gmaa==MAAstar || args.gmaa==MAAstarClassic)
         optimalSolutionMethod=true;

    GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *gmaa=0;
    FactoredQFunctionStateJAOHInterface *q;

    string filename="",timingsFilename="";
    ofstream of;
    if(!args.dryrun)
    {
        stringstream ss;
        ss << directories::MADPGetResultsFilename("GMAA_ELSI",
                *decpomdp,args)
           << "_" << SoftPrint(Qheur) << "_h" << horizon << "_restarts"
           << restarts << "_k" << k;
        filename=ss.str();
        of.open(filename.c_str());
        if(!of)
        {
            cerr << "GMAA: could not open " << filename << endl;
            return(1);
        }
        timingsFilename=filename + "Timings";

        cout << "Computing " << ss.str() << endl;
    }
    //tms timeStruct, 
    tms ts_before, ts_Qcomp, ts_after;
    clock_t ticks_before, ticks_Qcomp, ticks_after;
    
    ticks_before = times(&ts_before);

    PlanningUnitMADPDiscreteParameters params;
//    params.SetComputeAll(true);
    if(horizon >= 4)
    {
        params.SetComputeJointBeliefs(false);
        params.SetComputeJointActionObservationHistories(false);
//    params.SetComputeJointBeliefs(false);
//    params.SetUseSparseJointBeliefs(true);
    }
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    double V=-DBL_MAX;
    Time.Start("PlanningUnit");
    
    gmaa=new GMAA_MAA_ELSI(horizon, decpomdp, &params);

    if(!args.dryrun)
    {
        if(args.saveTimings)
            gmaa->SetIntermediateTimingFilename(timingsFilename);

        if(args.saveAllBGs)
        {
            string bgFilename=filename + "_BG";
            gmaa->SetSaveAllBGs(bgFilename);
        }
    }
    if(args.verbose)
        gmaa->SetVerbose(true);

    Time.Stop("PlanningUnit");
    cout << "GMAA Planner initialized" << endl;
    
    q=getQheuristic(gmaa,Qheur);
    Time.Start("ComputeQ");
    q->Compute();
    Time.Stop("ComputeQ");
    ticks_Qcomp = times(&ts_Qcomp);
    cout << "Q heuristic computed" << endl;

    //gmaa->SetQHeuristic(q);
    gmaa->SetFactoredQHeuristic(q);
    Time.Start("Plan");
    gmaa->Plan();
    V = gmaa->GetExpectedReward();
    Time.Stop("Plan");

    cout << "\nvalue="<< V << endl;
    if(args.verbose >= 0)
        gmaa->GetJointPolicyDiscretePure()->Print();

    ticks_after = times(&ts_after);
    clock_t ticks =  ticks_after - ticks_before;
    clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;

    clock_t time_maa = ticks_after - ticks_Qcomp;
    clock_t utime_maa = ts_after.tms_utime - ts_Qcomp.tms_utime;
    clock_t time_Qcomp = ticks_Qcomp - ticks_before;
    clock_t utime_Qcomp = ts_Qcomp.tms_utime - ts_before.tms_utime;

    // check if the value corresponds to the optimal value in case
    // this is an optimal method and we already computed it before
    OptimalValueDatabase db(gmaa);
    cout<<"OptimalValueDatabase: entry '"<<db.GetEntryName()<<"'"<<endl;
    //cout<<db.SoftPrint()<<endl;
    if(optimalSolutionMethod)
    {
        if(db.IsInDatabase())
        {
            if(!db.IsOptimal(V))
            {
                stringstream ss;
                ss << "OptimalValueDatabase: GMAA error, computed value " << V 
                   << " does not match"
                   << " previously computed optimal value "
                   << db.GetOptimalValue();
                of << ss.str() << endl;
                cout << ss.str() << endl;
                errorOccurred=true;
            }
            else
                cout<<"OptimalValueDatabase: Computed value matches with OptimalValueDatabase"<<endl;
        }
        else
        {
            cout << "OptimalValueDatabase: Optimal value unknown." << endl;
            if (args.testMode) // raise error when testing
                errorOccurred=true;
            else // otherwise save new value
                try { db.SetOptimalValue(V);}  
                catch(E& e){ e.Print(); }
        }
    }
    else // approximate methods
    {
        if(db.IsInDatabase())
        {
            cout << "OptimalValueDatabase: Computed value is " << V / db.GetOptimalValue()
                 << " of optimal (value " << db.GetOptimalValue() << ")"
                 << endl;
            if (V>db.GetOptimalValue())
                errorOccurred=true;
        }
        else
        {
            cout << "OptimalValueDatabase: Optimal value unknown." << endl;
            if (args.testMode) // raise error when testing
                errorOccurred=true;
        }
    }

    if(!args.dryrun)
    {
        of << horizon<<"\t";
        char s[10];
        sprintf(s, "%.6f", V);
        of << s <<"\t";
        of << ticks <<"\t";
        of << utime <<"\t";
        of << time_maa <<"\t";
        of << utime_maa <<"\t";
        of << time_Qcomp <<"\t";
        of << utime_Qcomp <<"\t";
        of << gmaa->GetNrEvaluatedJPolBGs() <<"\t";
        of << gmaa->GetMaxJPolPoolSize() <<"\t";
        //of << gmaa->GetJointPolicyPureVector()->GetIndex() <<"\t";
        of << gmaa->GetJointPolicyDiscretePure()->SoftPrintBrief() <<"\t";
        of << k <<"\n";
        of.flush();
    }

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        cout << endl << "Timing summary"<<endl;
        Time.PrintSummary();
        gmaa->PrintTimersSummary();
    }
    if(args.saveTimings && !args.dryrun)
        gmaa->SaveTimers(timingsFilename);

    }
    catch(E& e){ e.Print(); }

    return errorOccurred;
}